

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_get_utf8(archive_conflict *a,archive_mstring *aes,char **p)

{
  size_t n;
  wchar_t wVar1;
  char *fc;
  archive_string_conv *sc;
  
  wVar1 = aes->aes_set;
  if ((wVar1 & 2U) == 0) {
    *p = (char *)0x0;
    if ((wVar1 & 1U) == 0) {
      return L'\0';
    }
    fc = get_current_charset(a);
    sc = get_sconv_object(a,fc,"UTF-8",L'\x05');
    if (sc == (archive_string_conv *)0x0) {
      return L'\xffffffff';
    }
    n = (aes->aes_mbs).length;
    (aes->aes_mbs).length = 0;
    wVar1 = archive_strncat_l(&aes->aes_mbs,(aes->aes_mbs).s,n,sc);
    if (a == (archive_conflict *)0x0) {
      free_sconv_object(sc);
    }
    if (wVar1 != L'\0') {
      return L'\xffffffff';
    }
    *(byte *)&aes->aes_set = (byte)aes->aes_set | 2;
  }
  *p = (aes->aes_utf8).s;
  return L'\0';
}

Assistant:

int
archive_mstring_get_utf8(struct archive *a, struct archive_mstring *aes,
  const char **p)
{
	struct archive_string_conv *sc;
	int r;

	/* If we already have a UTF8 form, return that immediately. */
	if (aes->aes_set & AES_SET_UTF8) {
		*p = aes->aes_utf8.s;
		return (0);
	}

	*p = NULL;
	if (aes->aes_set & AES_SET_MBS) {
		sc = archive_string_conversion_to_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_mbs), aes->aes_mbs.s,
		    aes->aes_mbs.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		if (r == 0) {
			aes->aes_set |= AES_SET_UTF8;
			*p = aes->aes_utf8.s;
			return (0);/* success. */
		} else
			return (-1);/* failure. */
	}
	return (0);/* success. */
}